

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O2

void piweight(double *phi,double *theta,double *piw,int p,int q,int j)

{
  void *__ptr;
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  
  *piw = 1.0;
  __ptr = malloc((long)p * 8 + 8);
  uVar1 = 0;
  uVar2 = 0;
  if (0 < p) {
    uVar2 = (ulong)(uint)p;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    *(double *)((long)__ptr + uVar1 * 8 + 8) = phi[uVar1];
  }
  uVar2 = 0;
  uVar1 = (ulong)(uint)q;
  if (q < 1) {
    uVar1 = uVar2;
  }
  for (lVar3 = 1; lVar3 < j; lVar3 = lVar3 + 1) {
    piw[lVar3] = 0.0;
    dVar6 = 0.0;
    dVar7 = 0.0;
    if (lVar3 <= p) {
      dVar7 = -*(double *)((long)__ptr + lVar3 * 8);
      piw[lVar3] = dVar7;
    }
    uVar4 = uVar2;
    for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
      if (-1 < (long)uVar4) {
        dVar6 = dVar6 + theta[uVar5] * piw[uVar4];
      }
      uVar4 = uVar4 - 1;
    }
    piw[lVar3] = dVar7 - dVar6;
    uVar2 = uVar2 + 1;
  }
  free(__ptr);
  return;
}

Assistant:

void piweight(double *phi,double *theta,double *piw,int p,int q,int j) {
	int i,k;
	double temp;
	double *ph;
	piw[0] = 1.0;
	ph = (double*) malloc(sizeof(double) * (p+1));	
	ph[0] = -1.;
	for(i = 0; i < p;++i) {
		ph[i+1] = phi[i];
	}
	
	for(i = 1; i < j;++i) {
		piw[i] = 0.0;
		temp = 0.0;
		if(i <= p) {
			piw[i] = -ph[i];
		}
		for(k = 1; k < q+1;++k) {
			if((i - k) >= 0) {
				temp+=theta[k-1] * piw[i-k];
			} 
			
		}
		piw[i] -= temp;
	}
	
	free(ph);
	
}